

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_ExpandWithCustomEmitter::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  int iVar4;
  Template *this;
  string output;
  SizeofEmitter e;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  std::__cxx11::string::string((string *)&dict,"{{VAR}} {{VAR}}",(allocator *)&output);
  this = ctemplate::StringToTemplate((string *)&dict,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&output,"test_expand");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&output,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_a0,"VAR");
  ctemplate::TemplateString::TemplateString(&local_c0,"this song is just six words long");
  TVar1.length_ = local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_7_ = local_a0._17_7_;
  TVar1.id_ = local_a0.id_;
  TVar2.length_ = local_c0.length_;
  TVar2.ptr_ = local_c0.ptr_;
  TVar2.is_immutable_ = local_c0.is_immutable_;
  TVar2._17_7_ = local_c0._17_7_;
  TVar2.id_ = local_c0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  e.super_ExpandEmitter._vptr_ExpandEmitter = (_func_int **)&PTR__ExpandEmitter_0012bb90;
  e.outbuf_ = &output;
  bVar3 = ctemplate::Template::Expand
                    (this,&e.super_ExpandEmitter,(TemplateDictionaryInterface *)&dict);
  if (bVar3) {
    iVar4 = strcmp("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",
                   output._M_dataplus._M_p);
    if (iVar4 == 0) {
      std::__cxx11::string::~string((string *)&output);
      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x433,
           "strcmp(\"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\" \"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\", output.c_str()) == 0"
          );
    iVar4 = strcmp("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",
                   output._M_dataplus._M_p);
    if (iVar4 != 0) {
      __assert_fail("strcmp(\"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\" \"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX\", output.c_str()) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x433,"static void Test_Template_ExpandWithCustomEmitter::Run()");
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x430,"tpl->Expand(&e, &dict)");
    bVar3 = ctemplate::Template::Expand
                      (this,&e.super_ExpandEmitter,(TemplateDictionaryInterface *)&dict);
    if (!bVar3) {
      __assert_fail("tpl->Expand(&e, &dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x430,"static void Test_Template_ExpandWithCustomEmitter::Run()");
    }
  }
  exit(1);
}

Assistant:

TEST(Template, ExpandWithCustomEmitter) {
  Template* tpl = StringToTemplate("{{VAR}} {{VAR}}", STRIP_WHITESPACE);
  TemplateDictionary dict("test_expand");
  dict.SetValue("VAR", "this song is just six words long");
  string output;
  SizeofEmitter e(&output);
  ASSERT(tpl->Expand(&e, &dict));
  ASSERT_STREQ("XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX"
               "XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",
               output.c_str());
}